

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O2

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,33,1,0,33,1>>
               (Matrix<double,_33,_1,_0,_33,_1> *result,
               ChIntegrable3D<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  ChQuadratureTables *pCVar9;
  pointer pdVar10;
  reference pvVar11;
  pointer pdVar12;
  uint uVar13;
  uint uVar14;
  ulong __n;
  pointer this;
  uint uVar15;
  ulong uVar16;
  pointer this_00;
  ulong __n_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ChQuadratureTables *local_170;
  double local_160;
  ulong local_158;
  ulong local_150;
  double local_148;
  ChIntegrable3D<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *local_140;
  Matrix<double,_33,_1,_0,_33,_1> val;
  
  uVar16 = (ulong)(uint)order;
  local_140 = integrand;
  pCVar9 = GetStaticTables();
  local_158 = ((long)(pCVar9->Lroots).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar9->Lroots).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_150 = uVar16;
  if (local_158 < uVar16) {
    local_170 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(local_170,order,order);
    ChQuadratureTables::PrintTables(local_170);
    this_00 = (local_170->Weight).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this = (local_170->Lroots).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_170 = GetStaticTables();
    this = (local_170->Lroots).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (order + -1);
    this_00 = (local_170->Weight).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (order + -1);
  }
  val.super_PlainObjectBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>.m_storage.m_data.array[0] = 0.0
  ;
  dVar6 = (Xb - Xa) * 0.5;
  dVar7 = (Yb - Ya) * 0.5;
  dVar8 = (Zb - Za) * 0.5;
  local_148 = (Za + Zb) * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *)result,(Scalar *)&val);
  pdVar10 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (uVar15 = 0; uVar16 = (ulong)uVar15, uVar16 < (ulong)((long)pdVar12 - (long)pdVar10 >> 3);
      uVar15 = uVar15 + 1) {
    for (uVar14 = 0; __n = (ulong)uVar14, __n < (ulong)((long)pdVar12 - (long)pdVar10 >> 3);
        uVar14 = uVar14 + 1) {
      for (uVar13 = 0; __n_00 = (ulong)uVar13, __n_00 < (ulong)((long)pdVar12 - (long)pdVar10 >> 3);
          uVar13 = uVar13 + 1) {
        pvVar11 = std::vector<double,_std::allocator<double>_>::at(this,uVar16);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *pvVar11;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = (Xa + Xb) * 0.5;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = dVar6;
        auVar3 = vfmadd132sd_fma(auVar20,auVar17,auVar3);
        pvVar11 = std::vector<double,_std::allocator<double>_>::at(this,__n);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *pvVar11;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = (Ya + Yb) * 0.5;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = dVar7;
        auVar4 = vfmadd132sd_fma(auVar21,auVar18,auVar4);
        pvVar11 = std::vector<double,_std::allocator<double>_>::at(this,__n_00);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *pvVar11;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_148;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = dVar8;
        auVar5 = vfmadd132sd_fma(auVar22,auVar19,auVar5);
        (*local_140->_vptr_ChIntegrable3D[2])
                  (auVar3._0_8_,auVar4._0_8_,auVar5._0_8_,local_140,
                   (DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *)&val);
        pvVar11 = std::vector<double,_std::allocator<double>_>::at(this_00,uVar16);
        dVar1 = *pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
        dVar2 = *pvVar11;
        pvVar11 = std::vector<double,_std::allocator<double>_>::at(this_00,__n_00);
        local_160 = dVar1 * dVar2 * *pvVar11;
        Eigen::DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>::operator*=
                  ((DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *)&val,&local_160);
        Eigen::MatrixBase<Eigen::Matrix<double,33,1,0,33,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,33,1,0,33,1>> *)result,
                   (MatrixBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *)&val);
        pdVar10 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar12 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
    }
  }
  local_160 = dVar7 * dVar6 * dVar8;
  Eigen::DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_33,_1,_0,_33,_1>_> *)result,&local_160);
  if (local_158 < local_150) {
    ChQuadratureTables::~ChQuadratureTables(local_170);
    ::operator_delete(local_170,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }